

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O3

int32_t calculate_from_value(value_sec *value,int range_index)

{
  int *piVar1;
  
  piVar1 = borg.has;
  switch(value->type) {
  case VT_RANGE_INDEX:
    goto switchD_00221cc7_caseD_0;
  case VT_TRAIT:
    piVar1 = borg.trait;
    break;
  case VT_CONFIG:
    piVar1 = borg_cfg;
    break;
  case VT_ACTIVATION:
    piVar1 = borg.activation;
    break;
  case VT_CLASS:
    return (int32_t)(borg.trait[0x19] == value->index);
  }
  range_index = piVar1[value->index];
switchD_00221cc7_caseD_0:
  return range_index;
}

Assistant:

int32_t calculate_from_value(struct value_sec *value, int range_index)
{
    switch (value->type) {

    case VT_ACTIVATION:
        return borg.activation[value->index];

    case VT_TRAIT:
        return borg.trait[value->index];

    case VT_CONFIG:
        return borg_cfg[value->index];

    case VT_CLASS:
        return borg.trait[BI_CLASS] == value->index;

    case VT_RANGE_INDEX:
        return range_index;

    default:
        return borg.has[value->index];
    }
}